

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O2

bool __thiscall
duckdb::VersioningUtils::ParseSemver
          (VersioningUtils *this,string *semver,idx_t *major_out,idx_t *minor_out,idx_t *patch_out)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  undefined1 strict;
  string_t input;
  string_t input_00;
  string_t input_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  split;
  idx_t patch;
  idx_t minor;
  idx_t major;
  anon_union_16_2_67f50693_for_value local_c0;
  anon_union_16_2_67f50693_for_value local_b0;
  anon_union_16_2_67f50693_for_value local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> without_v;
  string local_70;
  string local_50;
  
  strict = SUB81(patch_out,0);
  ::std::__cxx11::string::string((string *)&local_50,(string *)this);
  ::std::__cxx11::string::string((string *)&local_70,"v",(allocator *)&without_v);
  bVar1 = StringUtil::StartsWith(&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)&without_v,(ulong)this);
    StringUtil::Split(&split,&without_v,'.');
    if ((long)split.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)split.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&split,0);
      string_t::string_t((string_t *)&local_a0.pointer,pvVar5);
      input.value.pointer.ptr = (char *)&major;
      input.value._0_8_ = local_a0.pointer.ptr;
      bVar2 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)local_a0._0_8_,input,(uint64_t *)0x0,(bool)strict);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&split,1);
      string_t::string_t((string_t *)&local_b0.pointer,pvVar5);
      input_00.value.pointer.ptr = (char *)&minor;
      input_00.value._0_8_ = local_b0.pointer.ptr;
      bVar3 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)local_b0._0_8_,input_00,(uint64_t *)0x0,(bool)strict);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&split,2);
      string_t::string_t((string_t *)&local_c0.pointer,pvVar5);
      input_01.value.pointer.ptr = (char *)&patch;
      input_01.value._0_8_ = local_c0.pointer.ptr;
      bVar4 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)local_c0._0_8_,input_01,(uint64_t *)0x0,(bool)strict);
      bVar1 = (bVar2 && bVar3) && bVar4;
      if ((bVar2 && bVar3) && bVar4) {
        (semver->_M_dataplus)._M_p = (pointer)major;
        *major_out = minor;
        *minor_out = patch;
      }
    }
    else {
      bVar1 = false;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&split);
    ::std::__cxx11::string::~string((string *)&without_v);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VersioningUtils::ParseSemver(string &semver, idx_t &major_out, idx_t &minor_out, idx_t &patch_out) {
	if (!StringUtil::StartsWith(semver, "v")) {
		return false;
	}

	auto without_v = semver.substr(1);

	auto split = StringUtil::Split(without_v, '.');

	if (split.size() != 3) {
		return false;
	}

	idx_t major, minor, patch;
	bool succeeded = true;

	succeeded &= TryCast::Operation<string_t, idx_t>(split[0], major);
	succeeded &= TryCast::Operation<string_t, idx_t>(split[1], minor);
	succeeded &= TryCast::Operation<string_t, idx_t>(split[2], patch);

	if (!succeeded) {
		return false;
	}

	major_out = major;
	minor_out = minor;
	patch_out = patch;

	return true;
}